

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat3 *matrixArray,size_t length)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&contiguous,length * 9,(allocator_type *)&binder);
  lVar2 = 0;
  sVar1 = length;
  while (bVar3 = sVar1 != 0, sVar1 = sVar1 - 1, bVar3) {
    priv::copyMatrix((float *)(matrixArray + lVar2),9,
                     (float *)((long)contiguous.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 0x24;
  }
  UniformBinder::UniformBinder(&binder,this,name);
  if (binder.location != -1) {
    (*sf_ptrc_glUniformMatrix3fvARB)
              (binder.location,(GLsizei)length,'\0',
               contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                       ,0x284,
                       "GLEXT_glUniformMatrix3fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0])"
                      );
  }
  UniformBinder::~UniformBinder(&binder);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&contiguous.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat3* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 3 * 3;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix3fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0]));
}